

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::GridProgram::GridProgram(GridProgram *this)

{
  ShaderProgramDeclaration *pSVar1;
  allocator<char> local_2b1;
  string local_2b0;
  FragmentSource local_290;
  allocator<char> local_269;
  string local_268;
  VertexSource local_248;
  FragmentOutput local_228;
  VertexToFragmentVarying local_224;
  allocator<char> local_219;
  string local_218;
  VertexAttribute local_1f8;
  allocator<char> local_1c9;
  string local_1c8;
  VertexAttribute local_1a8;
  allocator<char> local_169;
  string local_168;
  VertexAttribute local_148;
  ShaderProgramDeclaration local_120;
  GridProgram *local_10;
  GridProgram *this_local;
  
  local_10 = this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"a_position",&local_169);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_148,&local_168,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_120,&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"a_offset",&local_1c9);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1a8,&local_1c8,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"a_color",&local_219);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1f8,&local_218,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f8);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(&local_224,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_224);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_228,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,
             "#version 310 es\nin highp vec4 a_position;\nin highp vec4 a_offset;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main(void)\n{\n\tgl_Position = a_position + a_offset;\n\tv_color = a_color;\n}\n"
             ,&local_269);
  sglr::pdec::VertexSource::VertexSource(&local_248,&local_268);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,
             "#version 310 es\nlayout(location = 0) out highp vec4 dEQP_FragColor;\nin highp vec4 v_color;\nvoid main(void)\n{\n\tdEQP_FragColor = v_color;\n}\n"
             ,&local_2b1);
  sglr::pdec::FragmentSource::FragmentSource(&local_290,&local_2b0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_290);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::FragmentSource::~FragmentSource(&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  sglr::pdec::VertexSource::~VertexSource(&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_120);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032bc738;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032bc770;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032bc788;
  return;
}

Assistant:

GridProgram::GridProgram (void)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_offset", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource("#version 310 es\n"
														"in highp vec4 a_position;\n"
														"in highp vec4 a_offset;\n"
														"in highp vec4 a_color;\n"
														"out highp vec4 v_color;\n"
														"void main(void)\n"
														"{\n"
														"	gl_Position = a_position + a_offset;\n"
														"	v_color = a_color;\n"
														"}\n")
							<< sglr::pdec::FragmentSource(
														"#version 310 es\n"
														"layout(location = 0) out highp vec4 dEQP_FragColor;\n"
														"in highp vec4 v_color;\n"
														"void main(void)\n"
														"{\n"
														"	dEQP_FragColor = v_color;\n"
														"}\n"))
{
}